

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O0

char * nullcDebugGetNativeAddressLocation(void *address,uint full)

{
  bool bVar1;
  uint instruction_00;
  uint instruction;
  uint full_local;
  void *address_local;
  
  instruction_00 = nullcDebugConvertNativeAddressToInstruction(address);
  if (instruction_00 == 0xffffffff) {
    if (((NULLC::currExec == 1) && (NULLC::executorX86 != (ExecutorX86 *)0x0)) &&
       (bVar1 = ExecutorX86::IsCodeLaunchHeader(NULLC::executorX86,address), bVar1)) {
      address_local = anon_var_dwarf_3739;
    }
    else {
      address_local = (void *)0x0;
    }
  }
  else {
    address_local = nullcDebugGetVmAddressLocation(instruction_00,full);
  }
  return (char *)address_local;
}

Assistant:

const char* nullcDebugGetNativeAddressLocation(void *address, unsigned full)
{
	using namespace NULLC;

	unsigned instruction = nullcDebugConvertNativeAddressToInstruction(address);

	if(instruction == ~0u)
	{
#ifdef NULLC_BUILD_X86_JIT
		if(currExec == NULLC_X86 && executorX86 && executorX86->IsCodeLaunchHeader(address))
			return "[Transition to nullc]";
#endif

		return NULL;
	}

	return nullcDebugGetVmAddressLocation(instruction, full);
}